

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_draw.cpp
# Opt level: O2

void __thiscall
ImFontGlyphRangesBuilder::BuildRanges
          (ImFontGlyphRangesBuilder *this,ImVector_ImWchar_conflict1 *out_ranges)

{
  undefined1 in_AL;
  bool bVar1;
  undefined7 in_register_00000001;
  int iVar2;
  size_t n;
  undefined8 uStack_38;
  
  uStack_38 = CONCAT71(in_register_00000001,in_AL);
  iVar2 = 0;
  do {
    if (0xffff < iVar2) {
      uStack_38 = uStack_38 & 0xffffffffffff;
      ImVector<unsigned_short>::push_back
                ((ImVector<unsigned_short> *)out_ranges,(unsigned_short *)((long)&uStack_38 + 6));
      return;
    }
    n = (size_t)iVar2;
    bVar1 = GetBit(this,n);
    if (bVar1) {
      uStack_38._0_6_ = CONCAT24((short)iVar2,(undefined4)uStack_38);
      ImVector<unsigned_short>::push_back
                ((ImVector<unsigned_short> *)out_ranges,(unsigned_short *)((long)&uStack_38 + 4));
      iVar2 = iVar2 + -1;
      do {
        n = n + 1;
        if (n == 0x10000) {
          iVar2 = 0xffff;
          break;
        }
        bVar1 = GetBit(this,n);
        iVar2 = iVar2 + 1;
      } while (bVar1);
      uStack_38._0_4_ = CONCAT22((short)iVar2,(undefined2)uStack_38);
      ImVector<unsigned_short>::push_back
                ((ImVector<unsigned_short> *)out_ranges,(unsigned_short *)((long)&uStack_38 + 2));
    }
    iVar2 = iVar2 + 1;
  } while( true );
}

Assistant:

void ImFontGlyphRangesBuilder::BuildRanges(ImVector<ImWchar>* out_ranges)
{
    const int max_codepoint = IM_UNICODE_CODEPOINT_MAX;
    for (int n = 0; n <= max_codepoint; n++)
        if (GetBit(n))
        {
            out_ranges->push_back((ImWchar)n);
            while (n < max_codepoint && GetBit(n + 1))
                n++;
            out_ranges->push_back((ImWchar)n);
        }
    out_ranges->push_back(0);
}